

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_encode.c
# Opt level: O0

int cram_put_bam_seq(cram_fd *fd,bam_seq_t *b)

{
  int iVar1;
  int iVar2;
  spare_bams *__ptr;
  cram_container *pcVar3;
  int *piVar4;
  bam_seq_t **ppbVar5;
  bam1_t *pbVar6;
  bool bVar7;
  int local_44;
  spare_bams *spare;
  int curr_ref;
  int multi_seq;
  int curr_rec;
  int slice_rec;
  cram_container *c;
  bam_seq_t *b_local;
  cram_fd *fd_local;
  
  if (fd->ctr == (cram_container *)0x0) {
    pcVar3 = cram_new_container(fd->seqs_per_slice,fd->slices_per_container);
    fd->ctr = pcVar3;
    if (fd->ctr == (cram_container *)0x0) {
      return -1;
    }
    fd->ctr->record_counter = fd->record_counter;
  }
  _curr_rec = fd->ctr;
  if (((_curr_rec->slice == (cram_slice *)0x0) || (_curr_rec->curr_rec == _curr_rec->max_rec)) ||
     (((b->core).tid != _curr_rec->curr_ref && (-2 < _curr_rec->curr_ref)))) {
    bVar7 = fd->multi_seq == 1;
    if (_curr_rec->slice == (cram_slice *)0x0) {
      local_44 = (b->core).tid;
    }
    else {
      local_44 = _curr_rec->curr_ref;
    }
    if ((((fd->multi_seq == -1) && (_curr_rec->curr_rec < _curr_rec->max_rec / 4 + 10)) &&
        (fd->last_slice != 0)) &&
       ((fd->last_slice < _curr_rec->max_rec / 4 + 10 && (fd->embed_ref == 0)))) {
      if ((fd->verbose != 0) && (_curr_rec->multi_seq == 0)) {
        fprintf(_stderr,"Multi-ref enabled for this container\n",
                (long)_curr_rec->max_rec % 4 & 0xffffffff);
      }
      bVar7 = true;
    }
    iVar1 = _curr_rec->slice_rec;
    iVar2 = _curr_rec->curr_rec;
    if ((((fd->version >> 8 == 1) || (_curr_rec->curr_rec == _curr_rec->max_rec)) ||
        ((fd->multi_seq != 1 || (_curr_rec->slice == (cram_slice *)0x0)))) &&
       (_curr_rec = cram_next_container(fd,b), _curr_rec == (cram_container *)0x0)) {
      if (fd->ctr != (cram_container *)0x0) {
        cram_free_container(fd->ctr);
        fd->ctr = (cram_container *)0x0;
      }
      return -1;
    }
    if (bVar7) {
      fd->multi_seq = 1;
      _curr_rec->multi_seq = 1;
      _curr_rec->pos_sorted = 0;
      if (_curr_rec->refs_used == (int *)0x0) {
        pthread_mutex_lock((pthread_mutex_t *)&fd->ref_lock);
        piVar4 = (int *)calloc((long)fd->refs->nref,4);
        _curr_rec->refs_used = piVar4;
        pthread_mutex_unlock((pthread_mutex_t *)&fd->ref_lock);
        if (_curr_rec->refs_used == (int *)0x0) {
          return -1;
        }
      }
    }
    fd->last_slice = iVar2 - iVar1;
    _curr_rec->slice_rec = _curr_rec->curr_rec;
    if ((((-1 < (b->core).tid) && ((b->core).tid != local_44)) && (fd->embed_ref == 0)) &&
       ((fd->unsorted == 0 && (bVar7)))) {
      if (_curr_rec->refs_used == (int *)0x0) {
        pthread_mutex_lock((pthread_mutex_t *)&fd->ref_lock);
        piVar4 = (int *)calloc((long)fd->refs->nref,4);
        _curr_rec->refs_used = piVar4;
        pthread_mutex_unlock((pthread_mutex_t *)&fd->ref_lock);
        if (_curr_rec->refs_used == (int *)0x0) {
          return -1;
        }
      }
      else if ((_curr_rec->refs_used != (int *)0x0) && (_curr_rec->refs_used[(b->core).tid] != 0)) {
        fprintf(_stderr,"Unsorted mode enabled\n");
        pthread_mutex_lock((pthread_mutex_t *)&fd->ref_lock);
        fd->unsorted = 1;
        pthread_mutex_unlock((pthread_mutex_t *)&fd->ref_lock);
        fd->multi_seq = 1;
      }
    }
    _curr_rec->curr_ref = (b->core).tid;
    if ((_curr_rec->refs_used != (int *)0x0) && (-1 < _curr_rec->curr_ref)) {
      _curr_rec->refs_used[_curr_rec->curr_ref] = _curr_rec->refs_used[_curr_rec->curr_ref] + 1;
    }
  }
  if (_curr_rec->bams == (bam_seq_t **)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)&fd->bam_list_lock);
    if (fd->bl == (spare_bams *)0x0) {
      ppbVar5 = (bam_seq_t **)calloc((long)_curr_rec->max_c_rec,8);
      _curr_rec->bams = ppbVar5;
      if (_curr_rec->bams == (bam_seq_t **)0x0) {
        return -1;
      }
    }
    else {
      __ptr = fd->bl;
      _curr_rec->bams = __ptr->bams;
      fd->bl = __ptr->next;
      free(__ptr);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&fd->bam_list_lock);
  }
  if (_curr_rec->bams[_curr_rec->curr_c_rec] == (bam_seq_t *)0x0) {
    pbVar6 = bam_init1();
    pbVar6 = bam_copy1(pbVar6,b);
    _curr_rec->bams[_curr_rec->curr_c_rec] = pbVar6;
  }
  else {
    bam_copy1(_curr_rec->bams[_curr_rec->curr_c_rec],b);
  }
  _curr_rec->curr_rec = _curr_rec->curr_rec + 1;
  _curr_rec->curr_c_rec = _curr_rec->curr_c_rec + 1;
  fd->record_counter = fd->record_counter + 1;
  return 0;
}

Assistant:

int cram_put_bam_seq(cram_fd *fd, bam_seq_t *b) {
    cram_container *c;

    if (!fd->ctr) {
	fd->ctr = cram_new_container(fd->seqs_per_slice,
				     fd->slices_per_container);
	if (!fd->ctr)
	    return -1;
	fd->ctr->record_counter = fd->record_counter;
    }
    c = fd->ctr;

    if (!c->slice || c->curr_rec == c->max_rec ||
	(bam_ref(b) != c->curr_ref && c->curr_ref >= -1)) {
	int slice_rec, curr_rec, multi_seq = fd->multi_seq == 1;
	int curr_ref = c->slice ? c->curr_ref : bam_ref(b);


	/*
	 * Start packing slices when we routinely have under 1/4tr full.
	 *
	 * This option isn't available if we choose to embed references
	 * since we can only have one per slice.
	 */
	if (fd->multi_seq == -1 && c->curr_rec < c->max_rec/4+10 &&
	    fd->last_slice && fd->last_slice < c->max_rec/4+10 &&
	    !fd->embed_ref) {
	    if (fd->verbose && !c->multi_seq)
		fprintf(stderr, "Multi-ref enabled for this container\n");
	    multi_seq = 1;
	}

	slice_rec = c->slice_rec;
	curr_rec  = c->curr_rec;

	if (CRAM_MAJOR_VERS(fd->version) == 1 ||
	    c->curr_rec == c->max_rec || fd->multi_seq != 1 || !c->slice) {
	    if (NULL == (c = cram_next_container(fd, b))) {
		if (fd->ctr) {
		    // prevent cram_close attempting to flush
		    cram_free_container(fd->ctr);
		    fd->ctr = NULL;
		}
		return -1;
	    }
	}

	/*
	 * Due to our processing order, some things we've already done we
	 * cannot easily undo. So when we first notice we should be packing
	 * multiple sequences per container we emit the small partial
	 * container as-is and then start a fresh one in a different mode.
	 */
	if (multi_seq) {
	    fd->multi_seq = 1;
	    c->multi_seq = 1;
	    c->pos_sorted = 0; // required atm for multi_seq slices

	    if (!c->refs_used) {
		pthread_mutex_lock(&fd->ref_lock);
		c->refs_used = calloc(fd->refs->nref, sizeof(int));
		pthread_mutex_unlock(&fd->ref_lock);
		if (!c->refs_used)
		    return -1;
	    }
	}

	fd->last_slice = curr_rec - slice_rec;
	c->slice_rec = c->curr_rec;

	// Have we seen this reference before?
	if (bam_ref(b) >= 0 && bam_ref(b) != curr_ref && !fd->embed_ref &&
	    !fd->unsorted && multi_seq) {
	    
	    if (!c->refs_used) {
		pthread_mutex_lock(&fd->ref_lock);
		c->refs_used = calloc(fd->refs->nref, sizeof(int));
		pthread_mutex_unlock(&fd->ref_lock);
		if (!c->refs_used)
		    return -1;
	    } else if (c->refs_used && c->refs_used[bam_ref(b)]) {
		fprintf(stderr, "Unsorted mode enabled\n");
		pthread_mutex_lock(&fd->ref_lock);
		fd->unsorted = 1;
		pthread_mutex_unlock(&fd->ref_lock);
		fd->multi_seq = 1;
	    }
	}

	c->curr_ref = bam_ref(b);
	if (c->refs_used && c->curr_ref >= 0) c->refs_used[c->curr_ref]++;
    }

    if (!c->bams) {
	/* First time through, allocate a set of bam pointers */
	pthread_mutex_lock(&fd->bam_list_lock);
	if (fd->bl) {
	    spare_bams *spare = fd->bl;
	    c->bams = spare->bams;
	    fd->bl = spare->next;
	    free(spare);
	} else {
	    c->bams = calloc(c->max_c_rec, sizeof(bam_seq_t *));
	    if (!c->bams)
		return -1;
	}
	pthread_mutex_unlock(&fd->bam_list_lock);
    }

    /* Copy or alloc+copy the bam record, for later encoding */
    if (c->bams[c->curr_c_rec])
	bam_copy1(c->bams[c->curr_c_rec], b);
    else
	c->bams[c->curr_c_rec] = bam_dup(b);

    c->curr_rec++;
    c->curr_c_rec++;
    fd->record_counter++;

    return 0;
}